

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

void convert_mods(iasctx *ctx,easm_mods *mods)

{
  int iVar1;
  litem *plVar2;
  litem **__ptr;
  int iVar3;
  long lVar4;
  
  for (lVar4 = 0; lVar4 < mods->modsnum; lVar4 = lVar4 + 1) {
    plVar2 = (litem *)calloc(0x20,1);
    plVar2->type = LITEM_NAME;
    plVar2->str = mods->mods[lVar4]->str;
    iVar3 = ctx->atomsnum;
    iVar1 = ctx->atomsmax;
    __ptr = ctx->atoms;
    if (iVar1 <= iVar3) {
      iVar3 = iVar1 * 2;
      if (iVar1 == 0) {
        iVar3 = 0x10;
      }
      ctx->atomsmax = iVar3;
      __ptr = (litem **)realloc(__ptr,(long)iVar3 << 3);
      ctx->atoms = __ptr;
      iVar3 = ctx->atomsnum;
    }
    ctx->atomsnum = iVar3 + 1;
    __ptr[iVar3] = plVar2;
  }
  return;
}

Assistant:

void convert_mods(struct iasctx *ctx, struct easm_mods *mods) {
	int i;
	for (i = 0; i < mods->modsnum; i++) {
		struct litem *li = calloc(sizeof *li, 1);
		li->type = LITEM_NAME;
		li->str = mods->mods[i]->str;
		ADDARRAY(ctx->atoms, li);
	}
}